

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O0

void __thiscall
QNetworkManagerInterface::QNetworkManagerInterface(QNetworkManagerInterface *this,QObject *parent)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar4;
  QLatin1StringView QVar5;
  QDBusError error;
  QDBusPendingReply<QMap<QString,_QVariant>_> propsReply;
  QList<QVariant> argumentList;
  PropertiesDBusInterface managerPropertiesInterface;
  QDBusMessage *in_stack_fffffffffffffd88;
  QDBusError *in_stack_fffffffffffffd90;
  QDebug *this_00;
  QString *pQVar6;
  undefined1 in_stack_fffffffffffffda0 [16];
  undefined1 in_stack_fffffffffffffdb0 [16];
  QLatin1StringView in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  char *t;
  QLatin1String *local_218;
  QObject local_1b8 [24];
  undefined1 local_1a0 [24];
  undefined1 local_188 [24];
  undefined1 local_170 [24];
  QDBusConnection local_158 [72];
  QDebug local_110;
  undefined1 local_108 [88];
  QDBusMessage local_b0 [8];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  QDBusConnection local_88 [80];
  undefined8 local_38;
  undefined8 local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QNetworkManagerInterfaceBase::QNetworkManagerInterfaceBase
            ((QNetworkManagerInterfaceBase *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (QObject *)in_stack_fffffffffffffdc0.m_data);
  (in_RDI->d).d = (Data *)&PTR_metaObject_00128618;
  QMap<QString,_QVariant>::QMap((QMap<QString,_QVariant> *)0x108282);
  in_RDI[1].d.d = (Data *)0x0;
  *(undefined1 *)&in_RDI[1].d.ptr = 1;
  uVar3 = QDBusAbstractInterface::isValid();
  if ((uVar3 & 1) != 0) {
    local_38 = 0xaaaaaaaaaaaaaaaa;
    local_30 = 0xaaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_stack_fffffffffffffd90);
    QString::QString(in_stack_fffffffffffffda0._0_8_,in_stack_fffffffffffffdc0);
    Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_stack_fffffffffffffd90);
    QString::QString(in_stack_fffffffffffffda0._0_8_,in_stack_fffffffffffffdc0);
    Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_stack_fffffffffffffd90);
    QString::QString(in_stack_fffffffffffffda0._0_8_,in_stack_fffffffffffffdc0);
    QDBusConnection::systemBus();
    PropertiesDBusInterface::PropertiesDBusInterface
              ((PropertiesDBusInterface *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               (QString *)in_stack_fffffffffffffdc0.m_data,
               (QString *)in_stack_fffffffffffffdc0.m_size,in_stack_fffffffffffffdb0._8_8_,
               in_stack_fffffffffffffdb0._0_8_,in_stack_fffffffffffffda0._8_8_);
    QDBusConnection::~QDBusConnection(local_88);
    QString::~QString((QString *)0x1083c6);
    QString::~QString((QString *)0x1083d3);
    QString::~QString((QString *)0x1083e0);
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    local_98 = 0xaaaaaaaaaaaaaaaa;
    local_90 = 0xaaaaaaaaaaaaaaaa;
    QList<QVariant>::QList((QList<QVariant> *)0x10841a);
    QVar4 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDI,(size_t)in_stack_fffffffffffffd90);
    local_218 = (QLatin1String *)QVar4.m_size;
    QVariant::QVariant(&local_28,local_218);
    QList<QVariant>::operator<<
              ((QList<QVariant> *)in_stack_fffffffffffffd90,(rvalue_ref)in_stack_fffffffffffffd88);
    QVariant::~QVariant(&local_28);
    local_a8 = 0xaaaaaaaaaaaaaaaa;
    QVar4 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_RDI,(size_t)in_stack_fffffffffffffd90);
    t = (char *)QVar4.m_size;
    QString::QString(in_stack_fffffffffffffda0._0_8_,in_stack_fffffffffffffdc0);
    QDBusAbstractInterface::callWithArgumentList
              ((CallMode)local_b0,(QString *)&local_38,(QList_conflict *)0x1);
    QDBusPendingReply<QMap<QString,_QVariant>_>::QDBusPendingReply
              ((QDBusPendingReply<QMap<QString,_QVariant>_> *)in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88);
    QDBusMessage::~QDBusMessage(local_b0);
    QString::~QString((QString *)0x108508);
    uVar3 = QDBusPendingCall::isError();
    pQVar6 = in_stack_fffffffffffffda0._0_8_;
    if ((uVar3 & 1) == 0) {
      QDBusPendingReply<QMap<QString,_QVariant>_>::value
                ((QDBusPendingReply<QMap<QString,_QVariant>_> *)in_stack_fffffffffffffd88);
      QMap<QString,_QVariant>::operator=
                ((QMap<QString,_QVariant> *)in_stack_fffffffffffffd90,
                 (QMap<QString,_QVariant> *)in_stack_fffffffffffffd88);
      QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0x108640);
      QDBusConnection::systemBus();
      QVar4 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_RDI,(size_t)in_stack_fffffffffffffd90);
      QString::QString(pQVar6,QVar4);
      Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_stack_fffffffffffffd90)
      ;
      QString::QString(pQVar6,QVar4);
      QVar5 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_RDI,(size_t)in_stack_fffffffffffffd90);
      pQVar6 = (QString *)QVar5.m_size;
      QString::QString(pQVar6,QVar4);
      QString::QString(pQVar6,QVar4);
      bVar1 = QDBusConnection::connect
                        ((QString *)local_158,(QString *)local_170,(QString *)local_188,
                         (QString *)local_1a0,local_1b8,(char *)in_RDI);
      *(byte *)&in_RDI[1].d.ptr = bVar1 & 1;
      QString::~QString((QString *)0x108775);
      QString::~QString((QString *)0x108782);
      QString::~QString((QString *)0x10878f);
      QString::~QString((QString *)0x10879c);
      QDBusConnection::~QDBusConnection(local_158);
    }
    else {
      *(undefined1 *)&in_RDI[1].d.ptr = 0;
      memset(local_108,0xaa,0x40);
      QDBusPendingCall::error();
      iVar2 = QDBusError::type();
      if (iVar2 != 9) {
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffda0._0_8_,(char *)in_RDI,
                   (int)((ulong)in_stack_fffffffffffffd90 >> 0x20),(char *)in_stack_fffffffffffffd88
                  );
        QMessageLogger::warning();
        this_00 = in_stack_fffffffffffffda0._0_8_;
        in_stack_fffffffffffffd90 =
             (QDBusError *)QDebug::operator<<(in_stack_fffffffffffffda0._8_8_,t);
        QDBusError::message();
        QDebug::operator<<(this_00,in_RDI);
        QString::~QString((QString *)0x1085e1);
        QDebug::~QDebug(&local_110);
      }
      QDBusError::~QDBusError(in_stack_fffffffffffffd90);
    }
    QDBusPendingReply<QMap<QString,_QVariant>_>::~QDBusPendingReply
              ((QDBusPendingReply<QMap<QString,_QVariant>_> *)0x1087be);
    QList<QVariant>::~QList((QList<QVariant> *)0x1087cb);
    PropertiesDBusInterface::~PropertiesDBusInterface((PropertiesDBusInterface *)0x1087d8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QNetworkManagerInterface::QNetworkManagerInterface(QObject *parent)
    : QNetworkManagerInterfaceBase(parent)
{
    if (!QDBusAbstractInterface::isValid())
        return;

    PropertiesDBusInterface managerPropertiesInterface(
            NM_DBUS_SERVICE, NM_DBUS_PATH, DBUS_PROPERTIES_INTERFACE,
            QDBusConnection::systemBus());
    QList<QVariant> argumentList;
    argumentList << NM_DBUS_SERVICE;
    QDBusPendingReply<QVariantMap> propsReply = managerPropertiesInterface.callWithArgumentList(
            QDBus::Block, "GetAll"_L1, argumentList);
    if (propsReply.isError()) {
        validDBusConnection = false;
        if (auto error = propsReply.error(); error.type() != QDBusError::AccessDenied)
            qWarning() << "Failed to query NetworkManager properties:" << error.message();
        return;
    }
    propertyMap = propsReply.value();

    validDBusConnection = QDBusConnection::systemBus().connect(NM_DBUS_SERVICE, NM_DBUS_PATH,
            DBUS_PROPERTIES_INTERFACE, propertiesChangedKey, this,
            SLOT(setProperties(QString,QMap<QString,QVariant>,QList<QString>)));
}